

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

void __thiscall webrtc::WavWriter::WriteSamples(WavWriter *this,float *samples,size_t num_samples)

{
  unsigned_long *puVar1;
  unsigned_long local_1038;
  size_t local_1030;
  size_t chunk;
  int16_t isamples [2048];
  size_t i;
  size_t num_samples_local;
  float *samples_local;
  WavWriter *this_local;
  
  isamples[0x7fc] = 0;
  isamples[0x7fd] = 0;
  isamples[0x7fe] = 0;
  isamples[0x7ff] = 0;
  for (; (ulong)isamples._4088_8_ < num_samples; isamples._4088_8_ = isamples._4088_8_ + 0x800) {
    local_1038 = num_samples - isamples._4088_8_;
    puVar1 = std::min<unsigned_long>(&WriteSamples::kChunksize,&local_1038);
    local_1030 = *puVar1;
    FloatS16ToS16(samples + isamples._4088_8_,local_1030,(int16_t *)&chunk);
    WriteSamples(this,(int16_t *)&chunk,local_1030);
  }
  return;
}

Assistant:

void WavWriter::WriteSamples(const float* samples, size_t num_samples) {
  static const size_t kChunksize = 4096 / sizeof(uint16_t);
  for (size_t i = 0; i < num_samples; i += kChunksize) {
    int16_t isamples[kChunksize];
    const size_t chunk = std::min(kChunksize, num_samples - i);
    FloatS16ToS16(samples + i, chunk, isamples);
    WriteSamples(isamples, chunk);
  }
}